

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxels.cpp
# Opt level: O0

FVoxelDef * R_LoadVoxelDef(int lumpnum,int spin)

{
  char *pcVar1;
  FVoxelDef *this;
  FVoxelDef *local_28;
  FVoxelDef *voxdef;
  FVoxel *vox;
  int spin_local;
  int lumpnum_local;
  
  vox._0_4_ = spin;
  vox._4_4_ = lumpnum;
  voxdef = (FVoxelDef *)R_LoadKVX(lumpnum);
  if ((FVoxel *)voxdef == (FVoxel *)0x0) {
    pcVar1 = FWadCollection::GetLumpFullName(&Wads,vox._4_4_);
    Printf("%s is not a valid voxel file\n",pcVar1);
    _spin_local = (FVoxelDef *)0x0;
  }
  else {
    this = (FVoxelDef *)operator_new(0x28);
    FVoxelDef::FVoxelDef(this);
    this->Voxel = (FVoxel *)voxdef;
    this->Scale = 1.0;
    this->PlacedSpin = (int)vox;
    this->DroppedSpin = (int)vox;
    local_28 = this;
    TAngle<double>::operator=(&this->AngleOffset,90.0);
    TArray<FVoxel_*,_FVoxel_*>::Push(&Voxels.super_TArray<FVoxel_*,_FVoxel_*>,(FVoxel **)&voxdef);
    TArray<FVoxelDef_*,_FVoxelDef_*>::Push
              (&VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>,&local_28);
    _spin_local = local_28;
  }
  return _spin_local;
}

Assistant:

FVoxelDef *R_LoadVoxelDef(int lumpnum, int spin)
{
	FVoxel *vox = R_LoadKVX(lumpnum);
	if (vox == NULL)
	{
		Printf("%s is not a valid voxel file\n", Wads.GetLumpFullName(lumpnum));
		return NULL;
	}
	else
	{
		FVoxelDef *voxdef = new FVoxelDef;
		voxdef->Voxel = vox;
		voxdef->Scale = 1.;
		voxdef->DroppedSpin = voxdef->PlacedSpin = spin;
		voxdef->AngleOffset = 90.;

		Voxels.Push(vox);
		VoxelDefs.Push(voxdef);
		return voxdef;
	}
}